

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenStructMemberValueTS
          (string *__return_storage_ptr__,TsGenerator *this,StructDef *struct_def,string *prefix,
          string *delimiter,bool nullCheck)

{
  bool bVar1;
  reference ppFVar2;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_200;
  FieldDef **local_1f8;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  allocator<char> local_161;
  undefined1 local_160 [8];
  string nullValue;
  string local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> curr_member_accessor;
  FieldDef *field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_40;
  const_iterator it;
  bool nullCheck_local;
  string *delimiter_local;
  string *prefix_local;
  StructDef *struct_def_local;
  TsGenerator *this_local;
  string *ret;
  
  it._M_current._6_1_ = 0;
  it._M_current._7_1_ = nullCheck;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_40._M_current =
       (FieldDef **)
       std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                 (&(struct_def->fields).vec);
  while( true ) {
    field = (FieldDef *)
            std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                      (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=
                      (&local_40,
                       (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                        *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&local_40);
    curr_member_accessor.field_2._8_8_ = *ppFVar2;
    std::operator+(&local_90,prefix,".");
    Namer::Method<flatbuffers::FieldDef>
              (&local_c0,&(this->namer_).super_Namer,(FieldDef *)curr_member_accessor.field_2._8_8_)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   &local_90,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_90);
    bVar1 = std::operator!=(prefix,"this");
    if (bVar1) {
      std::operator+(&local_100,prefix,"?.");
      Namer::Method<flatbuffers::FieldDef>
                (&local_120,&(this->namer_).super_Namer,
                 (FieldDef *)curr_member_accessor.field_2._8_8_);
      std::operator+(&local_e0,&local_100,&local_120);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_100);
    }
    bVar1 = IsStruct((Type *)(curr_member_accessor.field_2._8_8_ + 200));
    if (bVar1) {
      GenStructMemberValueTS
                ((string *)((long)&nullValue.field_2 + 8),this,
                 *(StructDef **)(curr_member_accessor.field_2._8_8_ + 0xd0),(string *)local_70,
                 delimiter,true);
      std::__cxx11::string::operator+=
                ((string *)__return_storage_ptr__,(string *)(nullValue.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(nullValue.field_2._M_local_buf + 8));
    }
    else if ((it._M_current._7_1_ & 1) == 0) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_70);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_160,"0",&local_161);
      std::allocator<char>::~allocator(&local_161);
      if (*(int *)(curr_member_accessor.field_2._8_8_ + 200) == 2) {
        std::__cxx11::string::operator=((string *)local_160,"false");
      }
      else if ((*(int *)(curr_member_accessor.field_2._8_8_ + 200) == 9) ||
              (*(int *)(curr_member_accessor.field_2._8_8_ + 200) == 10)) {
        std::__cxx11::string::operator=((string *)local_160,"BigInt(0)");
      }
      else if (*(int *)(curr_member_accessor.field_2._8_8_ + 200) == 0x11) {
        std::__cxx11::string::operator=((string *)local_160,"[]");
      }
      std::operator+(&local_1e8,"(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
      std::operator+(&local_1c8,&local_1e8," ?? ");
      std::operator+(&local_1a8,&local_1c8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160)
      ;
      std::operator+(&local_188,&local_1a8,")");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)local_160);
    }
    local_1f8 = local_40._M_current;
    local_1f0 = std::
                next<__gnu_cxx::__normal_iterator<flatbuffers::FieldDef*const*,std::vector<flatbuffers::FieldDef*,std::allocator<flatbuffers::FieldDef*>>>>
                          (local_40,1);
    local_200._M_current =
         (FieldDef **)
         std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                   (&(struct_def->fields).vec);
    bVar1 = __gnu_cxx::operator!=(&local_1f0,&local_200);
    if (bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)delimiter);
    }
    std::__cxx11::string::~string((string *)local_70);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenStructMemberValueTS(const StructDef &struct_def,
                                     const std::string &prefix,
                                     const std::string &delimiter,
                                     const bool nullCheck = true) {
    std::string ret;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      auto &field = **it;

      auto curr_member_accessor = prefix + "." + namer_.Method(field);
      if (prefix != "this") {
        curr_member_accessor = prefix + "?." + namer_.Method(field);
      }
      if (IsStruct(field.value.type)) {
        ret += GenStructMemberValueTS(*field.value.type.struct_def,
                                      curr_member_accessor, delimiter);
      } else {
        if (nullCheck) {
          std::string nullValue = "0";
          if (field.value.type.base_type == BASE_TYPE_BOOL) {
            nullValue = "false";
          } else if (field.value.type.base_type == BASE_TYPE_LONG ||
                     field.value.type.base_type == BASE_TYPE_ULONG) {
            nullValue = "BigInt(0)";
          } else if (field.value.type.base_type == BASE_TYPE_ARRAY) {
            nullValue = "[]";
          }
          ret += "(" + curr_member_accessor + " ?? " + nullValue + ")";
        } else {
          ret += curr_member_accessor;
        }
      }

      if (std::next(it) != struct_def.fields.vec.end()) { ret += delimiter; }
    }

    return ret;
  }